

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

void ggml_build_backward_expand
               (ggml_context *ctx_static,ggml_context *ctx_compute,ggml_cgraph *cgraph,
               _Bool accumulate)

{
  _Bool *p_Var1;
  undefined8 uVar2;
  uint uVar3;
  ggml_type type;
  uint uVar4;
  ggml_op gVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ggml_tensor *key;
  ggml_tensor *key_00;
  ggml_tensor *key_01;
  long lVar10;
  size_t sVar11;
  ulong uVar12;
  size_t sVar13;
  ggml_cgraph *pgVar14;
  _Bool _Var15;
  size_t sVar16;
  ggml_tensor *pgVar17;
  size_t isrc;
  size_t sVar18;
  ggml_tensor *pgVar19;
  ggml_tensor *pgVar20;
  byte bVar21;
  char *pcVar22;
  byte bVar23;
  ggml_unary_op op;
  int i;
  ulong uVar24;
  long lVar25;
  byte bVar26;
  ulong nb3;
  ulong uVar27;
  int iVar28;
  bool bVar29;
  float s;
  ulong local_a8;
  ulong local_90;
  undefined8 local_80;
  void *local_78;
  ggml_hash_set *local_70;
  _Bool ignore_src [10];
  int iStack_5c;
  
  uVar3 = cgraph->n_nodes;
  if ((int)uVar3 < 1) {
    pcVar22 = "cgraph->n_nodes > 0";
    iVar28 = 0x16c0;
  }
  else if (cgraph->grads == (ggml_tensor **)0x0) {
    pcVar22 = "cgraph->grads";
    iVar28 = 0x16c1;
  }
  else if (cgraph->grad_accs == (ggml_tensor **)0x0) {
    pcVar22 = "cgraph->grad_accs";
    iVar28 = 0x16c2;
  }
  else {
    local_70 = &cgraph->visited_hash_set;
    uVar24 = 0;
    memset(cgraph->grads,0,(cgraph->visited_hash_set).size << 3);
    memset(cgraph->grad_accs,0,(cgraph->visited_hash_set).size << 3);
    local_78 = calloc((cgraph->visited_hash_set).size,1);
    bVar21 = 0;
    bVar26 = 0;
    do {
      bVar23 = 1;
      bVar29 = bVar21 == 0;
      bVar21 = 1;
      if (bVar29) {
        bVar21 = ((byte)cgraph->nodes[uVar24]->flags & 4) >> 2;
      }
      if (bVar26 == 0) {
        bVar23 = ((byte)cgraph->nodes[uVar24]->flags & 8) >> 3;
      }
      uVar24 = uVar24 + 1;
      bVar26 = bVar23;
    } while (uVar3 != uVar24);
    local_80 = cgraph;
    if (bVar21 == 0) {
      pcVar22 = 
      "any_params && \"no trainable parameters found, did you forget to call ggml_set_param?\"";
      iVar28 = 0x16d2;
    }
    else {
      if (bVar23 != 0) {
        uVar24 = 0;
        do {
          pgVar19 = cgraph->nodes[uVar24];
          type = pgVar19->type;
          if (type != GGML_TYPE_I32) {
            uVar4 = pgVar19->flags;
            stack0xffffffffffffffa0 = stack0xffffffffffffffa0 & 0xffffffffffff0000;
            ignore_src[0] = false;
            ignore_src[1] = false;
            ignore_src[2] = false;
            ignore_src[3] = false;
            ignore_src[4] = false;
            ignore_src[5] = false;
            ignore_src[6] = false;
            ignore_src[7] = false;
            gVar5 = pgVar19->op;
            uVar27 = (ulong)(gVar5 - GGML_OP_CPY);
            if (gVar5 - GGML_OP_CPY < 0x2b) {
              if ((0x20c1UL >> (uVar27 & 0x3f) & 1) == 0) {
                if (((0x60000UL >> (uVar27 & 0x3f) & 1) != 0) ||
                   ((uVar27 == 0x2a && ((pgVar19->op_params[0] & 0xfffffffdU) == 1)))) {
                  ignore_src[0] = true;
                  ignore_src[1] = false;
                  ignore_src[2] = false;
                  ignore_src[3] = false;
                  ignore_src[4] = false;
                  ignore_src[5] = false;
                  ignore_src[6] = false;
                  ignore_src[7] = false;
                }
              }
              else {
                ignore_src[0] = false;
                ignore_src[1] = true;
                ignore_src[2] = false;
                ignore_src[3] = false;
                ignore_src[4] = false;
                ignore_src[5] = false;
                ignore_src[6] = false;
                ignore_src[7] = false;
              }
            }
            lVar25 = 0x13;
            do {
              pgVar17 = (ggml_tensor *)pgVar19->ne[lVar25 + -2];
              if (((pgVar17 != (ggml_tensor *)0x0) &&
                  (*(char *)((long)&local_80 + lVar25 + 5) == '\0')) &&
                 (sVar16 = ggml_hash_find(local_70,pgVar17),
                 *(char *)((long)local_78 + sVar16) == '\x01')) {
                if (pgVar17->type < GGML_TYPE_Q4_0) goto LAB_001201d3;
                pcVar22 = 
                "node->src[j]->type == GGML_TYPE_F32 || node->src[j]->type == GGML_TYPE_F16";
                iVar28 = 0x16fc;
                goto LAB_00121e0b;
              }
              lVar25 = lVar25 + 1;
            } while (lVar25 != 0x1d);
            cgraph = local_80;
            if ((uVar4 & 0xc) != 0) {
LAB_001201d3:
              cgraph = local_80;
              if (((pgVar19->view_src != (ggml_tensor *)0x0) && (3 < gVar5 - GGML_OP_RESHAPE)) &&
                 (gVar5 != GGML_OP_CPY)) {
                pcVar22 = 
                "!node->view_src || node->op == GGML_OP_CPY || node->op == GGML_OP_VIEW || node->op == GGML_OP_RESHAPE || node->op == GGML_OP_PERMUTE || node->op == GGML_OP_TRANSPOSE"
                ;
                iVar28 = 0x1706;
                goto LAB_00121e0b;
              }
              sVar16 = ggml_hash_find(local_70,pgVar19);
              if (sVar16 == 0xffffffffffffffff) {
                pcVar22 = "igrad != GGML_HASHSET_FULL";
                iVar28 = 0x1709;
                goto LAB_00121e0b;
              }
              if (((cgraph->visited_hash_set).used[sVar16 >> 5] >> ((uint)sVar16 & 0x1f) & 1) == 0)
              {
                pcVar22 = "ggml_bitset_get(cgraph->visited_hash_set.used, igrad)";
                iVar28 = 0x170a;
                goto LAB_00121e0b;
              }
              if ((uVar4 & 4) != 0 && accumulate || (uVar4 & 8) != 0) {
                pgVar17 = ggml_new_tensor_impl(ctx_static,type,4,pgVar19->ne,(ggml_tensor *)0x0,0);
                cgraph->grad_accs[sVar16] = pgVar17;
                cgraph->grads[sVar16] = cgraph->grad_accs[sVar16];
                ggml_format_name(cgraph->grad_accs[sVar16],"grad acc for %s",pgVar19->name);
              }
              *(undefined1 *)((long)local_78 + sVar16) = 1;
            }
          }
          uVar24 = uVar24 + 1;
        } while (uVar24 != uVar3);
        iVar28 = uVar3 + 1;
        uVar24 = (ulong)(uVar3 - 1);
        do {
          pgVar19 = cgraph->nodes[uVar24];
          pgVar17 = ggml_graph_get_grad(cgraph,pgVar19);
          if (pgVar17 == (ggml_tensor *)0x0) goto LAB_001217f4;
          key = pgVar19->src[0];
          key_00 = pgVar19->src[1];
          key_01 = pgVar19->src[2];
          sVar16 = 0xffffffffffffffff;
          if (key != (ggml_tensor *)0x0) {
            sVar16 = ggml_hash_find(local_70,key);
          }
          isrc = 0xffffffffffffffff;
          if (key_00 != (ggml_tensor *)0x0) {
            isrc = ggml_hash_find(local_70,key_00);
          }
          if (key_01 == (ggml_tensor *)0x0) {
            sVar18 = 0xffffffffffffffff;
          }
          else {
            sVar18 = ggml_hash_find(local_70,key_01);
          }
          pgVar14 = local_80;
          if ((sVar16 == 0xffffffffffffffff || key == (ggml_tensor *)0x0) ||
             (((cgraph->visited_hash_set).used[sVar16 >> 5] >> ((uint)sVar16 & 0x1f) & 1) == 0)) {
            bVar26 = 0;
          }
          else {
            bVar26 = *(byte *)((long)local_78 + sVar16);
          }
          if ((isrc == 0xffffffffffffffff || key_00 == (ggml_tensor *)0x0) ||
             (((cgraph->visited_hash_set).used[isrc >> 5] >> ((uint)isrc & 0x1f) & 1) == 0)) {
            bVar21 = 0;
          }
          else {
            bVar21 = *(byte *)((long)local_78 + isrc);
          }
          if ((sVar18 == 0xffffffffffffffff || key_01 == (ggml_tensor *)0x0) ||
             (((cgraph->visited_hash_set).used[sVar18 >> 5] >> ((uint)sVar18 & 0x1f) & 1) == 0)) {
            bVar23 = 0;
          }
          else {
            bVar23 = *(byte *)((long)local_78 + sVar18);
          }
          switch(pgVar19->op) {
          case GGML_OP_NONE:
            goto switchD_0012048a_caseD_0;
          case GGML_OP_DUP:
          case GGML_OP_CPY:
            if (bVar26 == 0) break;
            ggml_add_or_set(ctx_compute,cgraph,sVar16,pgVar17);
            goto LAB_00121722;
          case GGML_OP_ADD:
            if (bVar26 != 0) {
              ggml_add_or_set(ctx_compute,cgraph,sVar16,pgVar17);
            }
            if (bVar21 != 0) {
              if (((key->ne[0] != key_00->ne[0]) || (key->ne[1] != key_00->ne[1])) ||
                 ((key->ne[2] != key_00->ne[2] || (key->ne[3] != key_00->ne[3])))) {
                pgVar17 = ggml_repeat_back(ctx_compute,pgVar17,key_00);
              }
LAB_00121423:
              ggml_add_or_set(ctx_compute,cgraph,isrc,pgVar17);
            }
            goto switchD_0012048a_caseD_0;
          case GGML_OP_ADD1:
            if (bVar26 != 0) {
              ggml_add_or_set(ctx_compute,cgraph,sVar16,pgVar17);
            }
            if (bVar21 != 0) {
              ignore_src[0] = true;
              ignore_src[1] = false;
              ignore_src[2] = false;
              ignore_src[3] = false;
              ignore_src[4] = false;
              ignore_src[5] = false;
              ignore_src[6] = false;
              ignore_src[7] = false;
              unique0x10000d69 = pgVar17->ne[1];
              pgVar19 = ggml_new_tensor_impl
                                  (ctx_compute,GGML_TYPE_F32,4,(int64_t *)ignore_src,
                                   (ggml_tensor *)0x0,0);
              pgVar19->op = GGML_OP_MEAN;
              pgVar19->src[0] = pgVar17;
              ggml_add_or_set(ctx_compute,cgraph,isrc,pgVar19);
            }
            goto switchD_0012048a_caseD_0;
          case GGML_OP_ACC:
            if (bVar26 != 0) {
              ggml_add_or_set(ctx_compute,cgraph,sVar16,pgVar17);
            }
            if (bVar21 != 0) {
              iVar6 = pgVar19->op_params[0];
              iVar7 = pgVar19->op_params[1];
              iVar8 = pgVar19->op_params[2];
              ignore_src._0_8_ = key_00->ne[0];
              unique0x10000d91 = key_00->ne[1];
              pgVar19 = ggml_view_impl(ctx_compute,pgVar17,4,(int64_t *)ignore_src,
                                       (long)pgVar19->op_params[3]);
              cgraph = local_80;
              pgVar19->nb[1] = (long)iVar6;
              pgVar19->nb[2] = (long)iVar7;
              pgVar19->nb[3] = (long)iVar8;
              pgVar19 = ggml_cont(ctx_compute,pgVar19);
              pgVar19 = ggml_reshape(ctx_compute,pgVar19,key_00);
              ggml_add_or_set(ctx_compute,cgraph,isrc,pgVar19);
            }
            goto switchD_0012048a_caseD_0;
          case GGML_OP_SUB:
            if (bVar26 != 0) {
              ggml_add_or_set(ctx_compute,cgraph,sVar16,pgVar17);
            }
            if (bVar21 != 0) {
              ggml_sub_or_set(ctx_compute,cgraph,isrc,pgVar17);
            }
            goto switchD_0012048a_caseD_0;
          case GGML_OP_MUL:
            if (bVar26 != 0) {
              pgVar19 = ggml_mul_impl(ctx_compute,pgVar17,key_00,false);
              ggml_add_or_set(ctx_compute,cgraph,sVar16,pgVar19);
            }
            if (bVar21 != 0) {
              pgVar17 = ggml_mul_impl(ctx_compute,key,pgVar17,false);
              if ((((key->ne[0] != key_00->ne[0]) || (key->ne[1] != key_00->ne[1])) ||
                  (key->ne[2] != key_00->ne[2])) || (key->ne[3] != key_00->ne[3])) {
                pgVar17 = ggml_repeat_back(ctx_compute,pgVar17,key_00);
              }
              goto LAB_00121423;
            }
            goto switchD_0012048a_caseD_0;
          case GGML_OP_DIV:
            if (bVar26 != 0) {
              pgVar20 = ggml_div_impl(ctx_compute,pgVar17,key_00,false);
              ggml_add_or_set(ctx_compute,cgraph,sVar16,pgVar20);
            }
            if (bVar21 != 0) {
              pgVar19 = ggml_div_impl(ctx_compute,pgVar19,key_00,false);
              pgVar19 = ggml_mul_impl(ctx_compute,pgVar17,pgVar19,false);
              ggml_sub_or_set(ctx_compute,cgraph,isrc,pgVar19);
            }
            goto switchD_0012048a_caseD_0;
          case GGML_OP_SQR:
            if (bVar26 != 0) {
              pgVar19 = ggml_mul_impl(ctx_compute,key,pgVar17,false);
              s = 2.0;
LAB_00120954:
              pgVar19 = ggml_scale_impl(ctx_compute,pgVar19,s,false);
LAB_00121583:
              ggml_add_or_set(ctx_compute,cgraph,sVar16,pgVar19);
              goto LAB_00121722;
            }
            break;
          case GGML_OP_SQRT:
            if (bVar26 != 0) {
              pgVar19 = ggml_div_impl(ctx_compute,pgVar17,pgVar19,false);
              s = 0.5;
              goto LAB_00120954;
            }
            break;
          case GGML_OP_LOG:
            if (bVar26 != 0) {
              pgVar19 = ggml_div_impl(ctx_compute,pgVar17,key,false);
LAB_001214de:
              ggml_add_or_set(ctx_compute,cgraph,sVar16,pgVar19);
              goto LAB_00121722;
            }
            break;
          case GGML_OP_SIN:
            if (bVar26 != 0) {
              pgVar19 = ggml_new_tensor_impl(ctx_compute,key->type,4,key->ne,(ggml_tensor *)0x0,0);
              pgVar19->op = GGML_OP_COS;
              pgVar19->src[0] = key;
              pgVar19 = ggml_mul_impl(ctx_compute,pgVar17,pgVar19,false);
LAB_00120cf1:
              ggml_add_or_set(ctx_compute,cgraph,sVar16,pgVar19);
              goto LAB_00121722;
            }
            break;
          case GGML_OP_COS:
            if (bVar26 != 0) {
              pgVar19 = ggml_new_tensor_impl(ctx_compute,key->type,4,key->ne,(ggml_tensor *)0x0,0);
              pgVar19->op = GGML_OP_SIN;
              pgVar19->src[0] = key;
              pgVar19 = ggml_mul_impl(ctx_compute,pgVar17,pgVar19,false);
              ggml_sub_or_set(ctx_compute,cgraph,sVar16,pgVar19);
              goto LAB_00121722;
            }
            break;
          case GGML_OP_SUM:
            if (bVar26 != 0) {
              ggml_add1_or_set(ctx_compute,cgraph,sVar16,pgVar17);
              goto LAB_00121722;
            }
            break;
          case GGML_OP_SUM_ROWS:
          case GGML_OP_REPEAT_BACK:
            if (bVar26 != 0) {
              pgVar19 = ggml_repeat(ctx_compute,pgVar17,key);
              goto LAB_001214de;
            }
            break;
          case GGML_OP_MEAN:
            if (bVar26 != 0) {
              pgVar19 = ggml_scale_impl(ctx_compute,pgVar17,1.0 / (float)key->ne[0],false);
              ggml_add1_or_set(ctx_compute,cgraph,sVar16,pgVar19);
              goto LAB_00121722;
            }
            break;
          default:
            ggml_build_backward_expand_cold_2();
            goto LAB_00121c24;
          case GGML_OP_REPEAT:
            if (bVar26 != 0) {
              pgVar19 = ggml_repeat_back(ctx_compute,pgVar17,key);
              goto LAB_001214de;
            }
            break;
          case GGML_OP_RMS_NORM:
            if (bVar26 != 0) {
              pgVar19 = ggml_rms_norm_back(ctx_compute,pgVar17,key,(float)pgVar19->op_params[0]);
              goto LAB_001214de;
            }
            break;
          case GGML_OP_MUL_MAT:
            if (bVar26 != 0) {
              if (pgVar17->ne[2] != key_00->ne[2]) {
                pcVar22 = "grad->ne[2] == src1->ne[2]";
                iVar28 = 0x1557;
                goto LAB_00121e0b;
              }
              if (pgVar17->ne[3] != key_00->ne[3]) {
                pcVar22 = "grad->ne[3] == src1->ne[3]";
                iVar28 = 0x1558;
                goto LAB_00121e0b;
              }
              pgVar19 = ggml_out_prod(ctx_compute,key_00,pgVar17);
              if (pgVar19->ne[0] != key->ne[0]) {
                pcVar22 = "tmp->ne[0] == src0->ne[0]";
                iVar28 = 0x155e;
                goto LAB_00121e0b;
              }
              if (pgVar19->ne[1] != key->ne[1]) {
                pcVar22 = "tmp->ne[1] == src0->ne[1]";
                iVar28 = 0x155f;
                goto LAB_00121e0b;
              }
              lVar25 = pgVar19->ne[2];
              lVar10 = key->ne[2];
              if ((lVar25 != lVar10) || (pgVar19->ne[3] != key->ne[3])) {
                if (pgVar19->ne[3] != 1) goto LAB_00121d24;
                sVar13 = pgVar19->nb[1];
                sVar11 = pgVar19->nb[2];
                ignore_src._0_8_ = pgVar19->ne[0];
                unique0x10001ec7 = pgVar19->ne[1];
                pgVar19 = ggml_view_impl(ctx_compute,pgVar19,4,(int64_t *)ignore_src,0);
                pgVar19->nb[1] = sVar13;
                pgVar19->nb[2] = sVar11 * (lVar25 / lVar10);
                pgVar19->nb[3] = sVar11;
                pgVar19 = ggml_repeat_back(ctx_compute,pgVar19,key);
                cgraph = local_80;
              }
              ggml_add_or_set(ctx_compute,cgraph,sVar16,pgVar19);
            }
            if (bVar21 != 0) {
              pgVar19 = ggml_transpose(ctx_compute,pgVar17);
              pgVar19 = ggml_out_prod(ctx_compute,key,pgVar19);
LAB_0012168b:
              ggml_add_or_set(ctx_compute,cgraph,isrc,pgVar19);
            }
            goto switchD_0012048a_caseD_0;
          case GGML_OP_SCALE:
            if (bVar26 != 0) {
              pgVar19 = ggml_scale_impl(ctx_compute,pgVar17,(float)pgVar19->op_params[0],false);
              goto LAB_001214de;
            }
            break;
          case GGML_OP_SET:
            iVar6 = pgVar19->op_params[0];
            iVar7 = pgVar19->op_params[1];
            iVar8 = pgVar19->op_params[2];
            iVar9 = pgVar19->op_params[3];
            if (((bVar26 | bVar21) & 1) == 0) {
              pgVar19 = (ggml_tensor *)0x0;
            }
            else {
              if (key->type != pgVar19->type) {
                pcVar22 = "src0->type == tensor->type";
                iVar28 = 0x158b;
                goto LAB_00121e0b;
              }
              pgVar19 = cgraph->grads[sVar16];
              if ((pgVar19 != (ggml_tensor *)0x0) && (pgVar19->type != pgVar17->type)) {
                pcVar22 = "!cgraph->grads[isrc0] || cgraph->grads[isrc0]->type == grad->type";
                iVar28 = 0x158c;
                goto LAB_00121e0b;
              }
              pgVar19 = cgraph->grads[isrc];
              if (((pgVar19 != (ggml_tensor *)0x0 & bVar21) == 1) &&
                 (pgVar19->type != pgVar17->type)) {
                pcVar22 = 
                "!cgraph->grads[isrc1] || !src1_needs_grads || cgraph->grads[isrc1]->type == grad->type"
                ;
                iVar28 = 0x158d;
                goto LAB_00121e0b;
              }
              ignore_src._0_8_ = key_00->ne[0];
              unique0x10000df1 = key_00->ne[1];
              pgVar19 = ggml_view_impl(ctx_compute,pgVar17,4,(int64_t *)ignore_src,(long)iVar9);
              pgVar19->nb[1] = (long)iVar6;
              pgVar19->nb[2] = (long)iVar7;
              pgVar19->nb[3] = (long)iVar8;
            }
            if (bVar26 != 0) {
              pgVar20 = ggml_unary_impl(ctx_compute,pgVar19,GGML_UNARY_OP_NEG,false);
              pgVar17 = ggml_acc_impl(ctx_compute,pgVar17,pgVar20,(long)iVar6,(long)iVar7,
                                      (long)iVar8,(long)iVar9,false);
              ggml_add_or_set(ctx_compute,cgraph,sVar16,pgVar17);
            }
            if (bVar21 != 0) {
              pgVar19 = ggml_cont(ctx_compute,pgVar19);
              pgVar19 = ggml_reshape(ctx_compute,pgVar19,key_00);
              ggml_add_or_set(ctx_compute,cgraph,isrc,pgVar19);
            }
            goto switchD_0012048a_caseD_0;
          case GGML_OP_CONT:
            if (bVar26 != 0) {
              if ((cgraph->grads[sVar16] == (ggml_tensor *)0x0) ||
                 (_Var15 = ggml_is_contiguous_n(cgraph->grads[sVar16],0), _Var15)) {
                _Var15 = ggml_is_contiguous_n(pgVar17,0);
                cgraph = local_80;
                if (_Var15) {
                  if (pgVar19->ne[2] * pgVar19->ne[3] * pgVar19->ne[1] * pgVar19->ne[0] -
                      key->ne[2] * key->ne[3] * key->ne[1] * key->ne[0] == 0) {
                    if (pgVar19->ne[3] != key->ne[3] ||
                        (pgVar19->ne[2] != key->ne[2] ||
                        (pgVar19->ne[1] != key->ne[1] || pgVar19->ne[0] != key->ne[0]))) {
                      pgVar17 = ggml_reshape(ctx_compute,pgVar17,key);
                    }
                    ggml_add_or_set(ctx_compute,cgraph,sVar16,pgVar17);
                    goto LAB_00121722;
                  }
                  pcVar22 = "ggml_nelements(tensor) == ggml_nelements(src0)";
                  iVar28 = 0x15ae;
                }
                else {
                  pcVar22 = "ggml_is_contiguous(grad)";
                  iVar28 = 0x15ad;
                }
              }
              else {
                pcVar22 = "!cgraph->grads[isrc0] || ggml_is_contiguous(cgraph->grads[isrc0])";
                iVar28 = 0x15ac;
              }
              goto LAB_00121e0b;
            }
            break;
          case GGML_OP_RESHAPE:
            if (bVar26 != 0) {
              _Var15 = ggml_is_contiguous_n(pgVar17,0);
              if (!_Var15) {
                pgVar17 = ggml_cont(ctx_compute,pgVar17);
              }
              pgVar19 = ggml_reshape(ctx_compute,pgVar17,key);
              ggml_add_or_set(ctx_compute,cgraph,sVar16,pgVar19);
              goto LAB_00121722;
            }
            break;
          case GGML_OP_VIEW:
            if (bVar26 != 0) {
              local_a8 = *(ulong *)pgVar19->op_params;
              local_90 = pgVar19->nb[1];
              uVar27 = pgVar19->nb[2];
              nb3 = pgVar19->nb[3];
              pgVar19 = cgraph->grads[sVar16];
              if (pgVar19 == (ggml_tensor *)0x0) {
                pgVar19 = (cgraph->visited_hash_set).keys[sVar16];
                if (pgVar19 != (ggml_tensor *)0x0) {
                  pgVar19 = ggml_scale_impl(ctx_compute,pgVar19,0.0,false);
                  bVar29 = false;
                  goto LAB_001219cc;
                }
              }
              else {
                if (key->type != pgVar19->type) {
                  uVar12 = type_traits[key->type].type_size;
                  if (local_a8 % uVar12 != 0) {
                    pcVar22 = "offset % n0 == 0";
                    iVar28 = 0x15c7;
                    goto LAB_00121e0b;
                  }
                  if (local_90 % uVar12 != 0) {
                    pcVar22 = "nb1 % n0 == 0";
                    iVar28 = 0x15c8;
                    goto LAB_00121e0b;
                  }
                  if (uVar27 % uVar12 != 0) {
                    pcVar22 = "nb2 % n0 == 0";
                    iVar28 = 0x15c9;
                    goto LAB_00121e0b;
                  }
                  if (nb3 % uVar12 != 0) {
                    pcVar22 = "nb3 % n0 == 0";
                    iVar28 = 0x15ca;
                    goto LAB_00121e0b;
                  }
                  sVar13 = type_traits[pgVar19->type].type_size;
                  local_a8 = (local_a8 / uVar12) * sVar13;
                  local_90 = (local_90 / uVar12) * sVar13;
                  uVar27 = (uVar27 / uVar12) * sVar13;
                  nb3 = (nb3 / uVar12) * sVar13;
                }
                if ((cgraph->visited_hash_set).keys[sVar16] != (ggml_tensor *)0x0) {
                  bVar29 = cgraph->grad_accs[sVar16] != (ggml_tensor *)0x0;
LAB_001219cc:
                  pgVar19 = ggml_acc_impl(ctx_compute,pgVar19,pgVar17,local_90,uVar27,nb3,local_a8,
                                          bVar29);
                  cgraph->grads[sVar16] = pgVar19;
                  ggml_format_name(cgraph->grads[sVar16],"grad for %s",
                                   (cgraph->visited_hash_set).keys[sVar16]->name);
                  ggml_build_forward_expand(cgraph,cgraph->grads[sVar16]);
                  goto LAB_00121722;
                }
              }
LAB_00121c24:
              pcVar22 = "src";
              iVar28 = 0x1487;
              goto LAB_00121e0b;
            }
            break;
          case GGML_OP_PERMUTE:
            if (bVar26 != 0) {
              uVar3 = pgVar19->op_params[2];
              uVar4 = pgVar19->op_params[3];
              ignore_src[0] = false;
              ignore_src[1] = false;
              ignore_src[2] = false;
              ignore_src[3] = false;
              ignore_src[4] = false;
              ignore_src[5] = false;
              ignore_src[6] = false;
              ignore_src[7] = false;
              stack0xffffffffffffffa0 = 0;
              p_Var1 = ignore_src + (ulong)(pgVar19->op_params[1] & 3) * 4;
              p_Var1[0] = true;
              p_Var1[1] = false;
              p_Var1[2] = false;
              p_Var1[3] = false;
              p_Var1 = ignore_src + (ulong)(uVar3 & 3) * 4;
              p_Var1[0] = true;
              p_Var1[1] = false;
              p_Var1[2] = false;
              p_Var1[3] = false;
              p_Var1 = ignore_src + (ulong)(uVar4 & 3) * 4;
              p_Var1[0] = true;
              p_Var1[1] = false;
              p_Var1[2] = false;
              p_Var1[3] = false;
              pgVar19 = ggml_permute(ctx_compute,pgVar17,ignore_src._0_4_,ignore_src._4_4_,
                                     stack0xffffffffffffffa0,iStack_5c);
              goto LAB_00120cf1;
            }
            break;
          case GGML_OP_TRANSPOSE:
            if (bVar26 != 0) {
              pgVar19 = ggml_transpose(ctx_compute,pgVar17);
LAB_0012129e:
              ggml_add_or_set(ctx_compute,cgraph,sVar16,pgVar19);
              goto LAB_00121722;
            }
            break;
          case GGML_OP_GET_ROWS:
            if (bVar26 != 0) {
              pgVar19 = ggml_get_rows_back(ctx_compute,pgVar17,key_00,key);
              goto LAB_001214de;
            }
            break;
          case GGML_OP_DIAG_MASK_INF:
          case GGML_OP_DIAG_MASK_ZERO:
            if (bVar26 != 0) {
              pgVar19 = ggml_diag_mask_zero_impl(ctx_compute,pgVar17,pgVar19->op_params[0],false);
              goto LAB_001214de;
            }
            break;
          case GGML_OP_SOFT_MAX:
            if (bVar26 != 0) {
              uVar2 = *(undefined8 *)pgVar19->op_params;
              pgVar20 = ggml_new_tensor_impl
                                  (ctx_compute,pgVar17->type,4,pgVar17->ne,(ggml_tensor *)0x0,0);
              pgVar20->op = GGML_OP_SOFT_MAX_BACK;
              pgVar20->src[0] = pgVar17;
              pgVar20->src[1] = pgVar19;
              *(undefined8 *)pgVar20->op_params = uVar2;
              ggml_add_or_set(ctx_compute,cgraph,sVar16,pgVar20);
            }
            if ((key_00 != (ggml_tensor *)0x0 & bVar21) != 1) goto switchD_0012048a_caseD_0;
            pcVar22 = 
            "(!src1 || !src1_needs_grads) && \"backward pass for softmax mask not implemented\"";
            iVar28 = 0x1608;
            goto LAB_00121e0b;
          case GGML_OP_ROPE:
            if (bVar26 != 0) {
              ignore_src._0_8_ = *(undefined8 *)(pgVar19->op_params + 0xb);
              unique0x10000dd1 = *(ulong *)(pgVar19->op_params + 0xd);
              if (pgVar17->ne[2] == key_00->ne[0]) {
                pgVar19 = ggml_rope_impl(ctx_compute,pgVar17,key_00,key_01,pgVar19->op_params[1],
                                         pgVar19->op_params[2],pgVar19->op_params[4],
                                         (float)pgVar19->op_params[5],(float)pgVar19->op_params[6],
                                         (float)pgVar19->op_params[7],(float)pgVar19->op_params[8],
                                         (float)pgVar19->op_params[9],(float)pgVar19->op_params[10],
                                         false);
              }
              else {
                pgVar19 = ggml_rope_multi(ctx_compute,pgVar17,key_00,key_01,pgVar19->op_params[1],
                                          (int *)ignore_src,pgVar19->op_params[2],
                                          pgVar19->op_params[4],(float)pgVar19->op_params[5],
                                          (float)pgVar19->op_params[6],(float)pgVar19->op_params[7],
                                          (float)pgVar19->op_params[8],(float)pgVar19->op_params[9],
                                          (float)pgVar19->op_params[10]);
              }
              pgVar19->op = GGML_OP_ROPE_BACK;
              ggml_add_or_set(ctx_compute,cgraph,sVar16,pgVar19);
            }
            if ((key_01 != (ggml_tensor *)0x0 & bVar23) != 1) goto switchD_0012048a_caseD_0;
            pcVar22 = 
            "(!src2 || !src2_needs_grads) && \"gradients for freq factors not implemented\"";
            iVar28 = 0x1623;
            goto LAB_00121e0b;
          case GGML_OP_IM2COL:
            if (bVar21 != 0) {
              pgVar19 = ggml_im2col_back(ctx_compute,pgVar17,key,key_00->ne,pgVar19->op_params[0],
                                         pgVar19->op_params[1],pgVar19->op_params[2],
                                         pgVar19->op_params[3],pgVar19->op_params[4],
                                         pgVar19->op_params[5],pgVar19->op_params[6] == 1);
              cgraph = pgVar14;
              goto LAB_0012168b;
            }
            goto switchD_0012048a_caseD_0;
          case GGML_OP_POOL_2D:
            if (bVar26 != 0) {
              pgVar19 = ggml_pool_2d_back(ctx_compute,pgVar17,key,pgVar19->op_params[0],
                                          pgVar19->op_params[1],pgVar19->op_params[2],
                                          pgVar19->op_params[3],pgVar19->op_params[4],
                                          (float)pgVar19->op_params[5],(float)pgVar19->op_params[6])
              ;
              goto LAB_0012129e;
            }
            break;
          case GGML_OP_WIN_PART:
          case GGML_OP_WIN_UNPART:
          case GGML_OP_UNARY:
            if (pgVar19->op != GGML_OP_UNARY) {
              pcVar22 = "tensor->op == GGML_OP_UNARY";
              iVar28 = 0x6c6;
              goto LAB_00121e0b;
            }
            switch(pgVar19->op_params[0]) {
            case 0:
              if (bVar26 != 0) {
                op = GGML_UNARY_OP_SGN;
LAB_00121563:
                pgVar19 = ggml_unary_impl(ctx_compute,key,op,false);
                pgVar19 = ggml_mul_impl(ctx_compute,pgVar19,pgVar17,false);
                goto LAB_00121583;
              }
              break;
            case 1:
            case 3:
              goto switchD_0012048a_caseD_0;
            case 2:
              if (bVar26 != 0) {
                ggml_sub_or_set(ctx_compute,cgraph,sVar16,pgVar17);
                goto LAB_00121722;
              }
              break;
            default:
              ggml_build_backward_expand_cold_1();
LAB_00121d24:
              pcVar22 = "tmp->ne[3] == 1";
              iVar28 = 0x1560;
              goto LAB_00121e0b;
            case 6:
              if (bVar26 != 0) {
                op = GGML_UNARY_OP_STEP;
                goto LAB_00121563;
              }
              break;
            case 10:
              if (bVar26 != 0) {
                pgVar19 = ggml_new_tensor_impl
                                    (ctx_compute,pgVar17->type,4,pgVar17->ne,(ggml_tensor *)0x0,0);
                pgVar19->op = GGML_OP_SILU_BACK;
                pgVar19->src[0] = pgVar17;
                pgVar19->src[1] = key;
                goto LAB_0012129e;
              }
              break;
            case 0xd:
              if (bVar26 != 0) {
                pgVar19 = ggml_mul_impl(ctx_compute,pgVar19,pgVar17,false);
                goto LAB_001214de;
              }
            }
            break;
          case GGML_OP_CROSS_ENTROPY_LOSS:
            if (bVar26 != 0) {
              pgVar19 = ggml_cross_entropy_loss_back(ctx_compute,pgVar17,key,key_00);
              ggml_add_or_set(ctx_compute,cgraph,sVar16,pgVar19);
            }
            if (bVar21 != 0) {
              pcVar22 = "!src1_needs_grads && \"backward pass for labels not implemented\"";
              iVar28 = 0x166d;
              goto LAB_00121e0b;
            }
switchD_0012048a_caseD_0:
            if (bVar26 != 0) {
LAB_00121722:
              pgVar19 = cgraph->grads[sVar16];
              if (((key->ne[0] != pgVar19->ne[0]) || (key->ne[1] != pgVar19->ne[1])) ||
                 ((key->ne[2] != pgVar19->ne[2] || (key->ne[3] != pgVar19->ne[3])))) {
                pcVar22 = "!src0_needs_grads || ggml_are_same_shape(src0, cgraph->grads[isrc0])";
                iVar28 = 0x1679;
                goto LAB_00121e0b;
              }
            }
          }
          if ((bVar21 != 0) &&
             ((((pgVar19 = cgraph->grads[isrc], key_00->ne[0] != pgVar19->ne[0] ||
                (key_00->ne[1] != pgVar19->ne[1])) || (key_00->ne[2] != pgVar19->ne[2])) ||
              (key_00->ne[3] != pgVar19->ne[3])))) {
            pcVar22 = "!src1_needs_grads || ggml_are_same_shape(src1, cgraph->grads[isrc1])";
            iVar28 = 0x167a;
            goto LAB_00121e0b;
          }
          if ((bVar23 != 0) &&
             (((pgVar19 = cgraph->grads[sVar18], key_01->ne[0] != pgVar19->ne[0] ||
               (key_01->ne[1] != pgVar19->ne[1])) ||
              ((key_01->ne[2] != pgVar19->ne[2] || (key_01->ne[3] != pgVar19->ne[3])))))) {
            pcVar22 = "!src2_needs_grads || ggml_are_same_shape(src2, cgraph->grads[isrc2])";
            iVar28 = 0x167b;
            goto LAB_00121e0b;
          }
LAB_001217f4:
          iVar28 = iVar28 + -1;
          uVar24 = uVar24 - 1;
          if (iVar28 < 2) {
            free(local_78);
            return;
          }
        } while( true );
      }
      pcVar22 = "any_loss && \"no training loss found, did you forget to call ggml_set_loss?\"";
      iVar28 = 0x16d3;
    }
  }
LAB_00121e0b:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",iVar28,
             "GGML_ASSERT(%s) failed",pcVar22);
}

Assistant:

void ggml_build_backward_expand(
        struct ggml_context * ctx_static,
        struct ggml_context * ctx_compute,
        struct ggml_cgraph  * cgraph,
        bool                  accumulate) {
    GGML_ASSERT(cgraph->n_nodes > 0);
    GGML_ASSERT(cgraph->grads);
    GGML_ASSERT(cgraph->grad_accs);

    const int n_nodes_f = cgraph->n_nodes;

    memset(cgraph->grads,     0, cgraph->visited_hash_set.size*sizeof(struct ggml_tensor *));
    memset(cgraph->grad_accs, 0, cgraph->visited_hash_set.size*sizeof(struct ggml_tensor *));
    bool * grads_needed = calloc(cgraph->visited_hash_set.size, sizeof(bool));

    {
        bool any_params = false;
        bool any_loss   = false;
        for (int i = 0; i < n_nodes_f; ++i) {
            struct ggml_tensor * node = cgraph->nodes[i];
            any_params = any_params || (node->flags & GGML_TENSOR_FLAG_PARAM);
            any_loss   = any_loss   || (node->flags & GGML_TENSOR_FLAG_LOSS);
        }
        GGML_ASSERT(any_params && "no trainable parameters found, did you forget to call ggml_set_param?");
        GGML_ASSERT(any_loss && "no training loss found, did you forget to call ggml_set_loss?");
    }

    for (int i = 0; i < n_nodes_f; ++i) {
        struct ggml_tensor * node = cgraph->nodes[i];

        if (node->type == GGML_TYPE_I32) {
            continue;
        }

        bool node_needs_grad = (node->flags & GGML_TENSOR_FLAG_PARAM) || (node->flags & GGML_TENSOR_FLAG_LOSS);
        bool ignore_src[GGML_MAX_SRC] = {false};
        switch (node->op) {
            // gradients in node->src[0] for one reason or another have no effect on output gradients
            case GGML_OP_IM2COL:      // only used for its shape
            case GGML_OP_IM2COL_BACK: // same as IM2COL
                ignore_src[0] = true;
                break;
            case GGML_OP_UNARY: {
                const enum ggml_unary_op uop = ggml_get_unary_op(node);
                // SGN and STEP unary ops are piecewise constant
                if (uop == GGML_UNARY_OP_SGN || uop == GGML_UNARY_OP_STEP) {
                    ignore_src[0] = true;
                }
            } break;

            // gradients in node->src[1] for one reason or another have no effect on output gradients
            case GGML_OP_CPY:           // gradients in CPY target are irrelevant
            case GGML_OP_GET_ROWS:      // row indices not differentiable
            case GGML_OP_GET_ROWS_BACK: // same as for GET_ROWS
            case GGML_OP_ROPE:          // positions not differentiable
                ignore_src[1] = true;
                break;

            default:
                break;
        }
        for (int j = 0; j < GGML_MAX_SRC; ++j) {
            if (!node->src[j] || ignore_src[j] || !grads_needed[ggml_hash_find(&cgraph->visited_hash_set, node->src[j])]) {
                continue;
            }
            GGML_ASSERT(node->src[j]->type == GGML_TYPE_F32 || node->src[j]->type == GGML_TYPE_F16);
            node_needs_grad = true;
            break;
        }
        if (!node_needs_grad) {
            continue;
        }

        // inplace operations are currently not supported
        GGML_ASSERT(!node->view_src || node->op == GGML_OP_CPY || node->op == GGML_OP_VIEW ||
            node->op == GGML_OP_RESHAPE || node->op == GGML_OP_PERMUTE || node->op == GGML_OP_TRANSPOSE);

        const size_t igrad = ggml_hash_find(&cgraph->visited_hash_set, node);
        GGML_ASSERT(igrad != GGML_HASHSET_FULL);
        GGML_ASSERT(ggml_bitset_get(cgraph->visited_hash_set.used, igrad));
        if ((accumulate && (node->flags & GGML_TENSOR_FLAG_PARAM)) || (node->flags & GGML_TENSOR_FLAG_LOSS)) {
            cgraph->grad_accs[igrad] = ggml_dup_tensor(ctx_static, node);
            cgraph->grads[igrad]     = cgraph->grad_accs[igrad];
            ggml_format_name(cgraph->grad_accs[igrad], "grad acc for %s", node->name);
        }
        grads_needed[igrad] = true;
    }

    for (int i = n_nodes_f - 1; i >= 0; --i) {
        // inplace operations to add gradients are not created by ggml_compute_backward except for gradient accumulation
        // use allocator to automatically make inplace operations
        ggml_compute_backward(ctx_compute, cgraph, i, grads_needed);
    }

    free(grads_needed);
}